

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defuse.h
# Opt level: O0

int __thiscall mocker::DefUseChain::init(DefUseChain *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  BasicBlockList *pBVar2;
  mapped_type *this_00;
  undefined7 extraout_var;
  reference pBVar3;
  InstList *pIVar4;
  vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>> *this_01;
  size_t local_120;
  undefined4 local_114;
  undefined1 local_110 [8];
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Addr> *operand;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *__range4;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  shared_ptr<mocker::ir::IRInst> *inst_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  InstList *__range3_1;
  BasicBlock *bb_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  BasicBlockList *__range2_1;
  initializer_list<mocker::DefUseChain::Use> local_78;
  undefined1 local_68 [8];
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end3;
  const_iterator __begin3;
  InstList *__range3;
  BasicBlock *bb;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockList *__range2;
  FunctionModule *func_local;
  DefUseChain *this_local;
  
  pBVar2 = ir::FunctionModule::getBBs_abi_cxx11_((FunctionModule *)ctx);
  __end2 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(pBVar2);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (pBVar2);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&bb), bVar1) {
    pBVar3 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end2);
    pIVar4 = ir::BasicBlock::getInsts_abi_cxx11_(pBVar3);
    __end3 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(pIVar4);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(pIVar4);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&inst), bVar1) {
      dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end3);
      ir::getDest((ir *)local_68,
                  (shared_ptr<mocker::ir::IRInst> *)
                  dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
      if (bVar1) {
        std::initializer_list<mocker::DefUseChain::Use>::initializer_list(&local_78);
        this_00 = std::
                  unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>_>
                  ::operator[](&this->chain,(key_type *)local_68);
        std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>::operator=
                  (this_00,local_78);
      }
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_68);
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end3);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end2);
  }
  pBVar2 = ir::FunctionModule::getBBs_abi_cxx11_((FunctionModule *)ctx);
  __end2_1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
             begin(pBVar2);
  bb_1 = (BasicBlock *)
         std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                   (pBVar2);
  while( true ) {
    bVar1 = std::operator!=(&__end2_1,(_Self *)&bb_1);
    if (!bVar1) break;
    pBVar3 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end2_1);
    pIVar4 = ir::BasicBlock::getInsts_abi_cxx11_(pBVar3);
    __end3_1 = std::__cxx11::
               list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
               ::begin(pIVar4);
    inst_1 = (shared_ptr<mocker::ir::IRInst> *)
             std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::end(pIVar4);
    while (bVar1 = std::operator!=(&__end3_1,(_Self *)&inst_1), bVar1) {
      operands.
      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                              (&__end3_1);
      ir::getOperandsUsed((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           *)&__range4,
                          (shared_ptr<mocker::ir::IRInst> *)
                          operands.
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end4 = std::
               vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ::begin((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                        *)&__range4);
      operand = (shared_ptr<mocker::ir::Addr> *)
                std::
                vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ::end((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       *)&__range4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                         *)&operand), bVar1) {
        reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
             ::operator*(&__end4);
        ir::dycLocalReg((ir *)local_110,
                        (shared_ptr<mocker::ir::Addr> *)
                        reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_110);
        if (bVar1) {
          this_01 = (vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>> *)
                    std::
                    unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>_>
                    ::operator[](&this->chain,(key_type *)local_110);
          local_120 = ir::BasicBlock::getLabelID(pBVar3);
          std::vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>>::
          emplace_back<unsigned_long,std::shared_ptr<mocker::ir::IRInst>const&>
                    (this_01,&local_120,
                     (shared_ptr<mocker::ir::IRInst> *)
                     operands.
                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_114 = 0;
        }
        else {
          local_114 = 0xb;
        }
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_110);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
        ::operator++(&__end4);
      }
      std::
      vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
      ::~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 *)&__range4);
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end3_1);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end2_1);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void init(const ir::FunctionModule &func) {
    for (auto &bb : func.getBBs()) {
      for (auto &inst : bb.getInsts()) {
        if (auto dest = ir::getDest(inst))
          chain[dest] = {};
      }
    }

    for (auto &bb : func.getBBs()) {
      for (auto &inst : bb.getInsts()) {
        auto operands = ir::getOperandsUsed(inst);
        for (auto &operand : operands) {
          auto reg = ir::dycLocalReg(operand);
          if (!reg)
            continue;
          chain[reg].emplace_back(bb.getLabelID(), inst);
        }
      }
    }
  }